

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Performance::ShaderCompilerCase::iterate(ShaderCompilerCase *this)

{
  Logs *pLVar1;
  size_type *psVar2;
  TestLog *this_00;
  TestContext *this_01;
  ShaderCompilerCase *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint64 dVar9;
  deUint64 dVar10;
  deUint64 dVar11;
  MessageBuilder *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  code *__n_00;
  string *psVar12;
  deUint32 id;
  int precision;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  uint uVar13;
  int iVar14;
  int iVar15;
  int __fd;
  char *pcVar16;
  Measurement *this_03;
  float fVar17;
  ShadersAndProgram SVar18;
  int local_7ec;
  string local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  code *local_7a8;
  string local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  deInt64 specializationTime;
  deInt64 timeWithoutDraw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  ShaderCompilerCase *local_710;
  deUint64 local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  string statNamePrefix_1;
  string local_6c0;
  allocator<char> local_69a;
  allocator<char> local_699;
  string local_698;
  vector<long,_std::allocator<long>_> rangeTotalTimes;
  string statNamePrefix;
  vector<long,_std::allocator<long>_> rangeSpecializationTimes;
  vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
  measurements;
  string local_5a8;
  vector<long,_std::allocator<long>_> totalTimesWithoutDraw;
  vector<long,_std::allocator<long>_> specializationTimes;
  vector<long,_std::allocator<long>_> secondDrawTimes;
  vector<long,_std::allocator<long>_> secondInputTimes;
  vector<long,_std::allocator<long>_> firstDrawTimes;
  vector<long,_std::allocator<long>_> firstInputSetTimes;
  vector<long,_std::allocator<long>_> programLinkTimes;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  ProgramContext progCtx;
  vector<long,_std::allocator<long>_> secondPhaseTimes;
  vector<long,_std::allocator<long>_> firstPhaseTimes;
  BuildInfo buildInfo;
  ProgramContext latestProgramContext;
  BuildInfo latestBuildInfo;
  
  dVar7 = getSpecializationID(this,0);
  progCtx.vertShaderSource._M_dataplus._M_p = (pointer)&progCtx.vertShaderSource.field_2;
  progCtx.vertShaderSource._M_string_length = 0;
  progCtx.vertShaderSource.field_2._M_local_buf[0] = '\0';
  progCtx.fragShaderSource._M_dataplus._M_p = (pointer)&progCtx.fragShaderSource.field_2;
  progCtx.fragShaderSource._M_string_length = 0;
  progCtx.fragShaderSource.field_2._M_local_buf[0] = '\0';
  progCtx.vertexAttributes.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  progCtx.vertexAttributes.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  progCtx.vertexAttributes.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  progCtx.uniforms.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  progCtx.uniforms.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  progCtx.uniforms.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  singleVaryingVertexTemplate_abi_cxx11_();
  specializeShaderSource
            ((string *)&buildInfo,&latestProgramContext.vertShaderSource,dVar7,SHADER_VALIDITY_VALID
            );
  std::__cxx11::string::operator=((string *)&progCtx,(string *)&buildInfo);
  std::__cxx11::string::~string((string *)&buildInfo);
  std::__cxx11::string::~string((string *)&latestProgramContext);
  singleVaryingFragmentTemplate_abi_cxx11_();
  specializeShaderSource
            ((string *)&buildInfo,&latestProgramContext.vertShaderSource,dVar7,SHADER_VALIDITY_VALID
            );
  std::__cxx11::string::operator=((string *)&progCtx.fragShaderSource,(string *)&buildInfo);
  std::__cxx11::string::~string((string *)&buildInfo);
  std::__cxx11::string::~string((string *)&latestProgramContext);
  getNameSpecialization_abi_cxx11_((string *)&buildInfo,(Performance *)(ulong)dVar7,id);
  singleValueShaderAttributes
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)&latestProgramContext,(string *)&buildInfo);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::_M_move_assign(&progCtx.vertexAttributes,&latestProgramContext);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&latestProgramContext);
  std::__cxx11::string::~string((string *)&buildInfo);
  SVar18 = createShadersAndProgram(this);
  dVar7 = SVar18.program;
  latestBuildInfo._0_8_ = SVar18._0_8_;
  latestBuildInfo.logs.vert._M_dataplus._M_p._0_4_ = dVar7;
  setShaderSources(this,SVar18.vertShader,SVar18.fragShader,&progCtx);
  buildInfo.logs.vert._M_dataplus._M_p = (pointer)&buildInfo.logs.vert.field_2;
  buildInfo.logs.vert._M_string_length = 0;
  buildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
  buildInfo.logs.frag._M_dataplus._M_p = (pointer)&buildInfo.logs.frag.field_2;
  buildInfo.logs.frag._M_string_length = 0;
  pLVar1 = &buildInfo.logs;
  buildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
  buildInfo.logs.link._M_dataplus._M_p = (pointer)&buildInfo.logs.link.field_2;
  buildInfo.logs.link._M_string_length = 0;
  buildInfo.logs.link.field_2._M_local_buf[0] = '\0';
  bVar6 = compileShader(this,SVar18.vertShader);
  buildInfo.vertCompileSuccess = bVar6;
  bVar6 = compileShader(this,SVar18.fragShader);
  buildInfo.fragCompileSuccess = bVar6;
  bVar6 = linkAndUseProgram(this,dVar7);
  uVar4 = buildInfo._0_8_;
  buildInfo.linkSuccess = bVar6;
  uVar5 = buildInfo._0_8_;
  buildInfo.vertCompileSuccess = SUB81(uVar4,0);
  buildInfo._0_8_ = uVar5;
  if ((buildInfo.vertCompileSuccess == true) &&
     (buildInfo.fragCompileSuccess = SUB81(uVar4,1), (bVar6 & buildInfo.fragCompileSuccess) != 0)) {
    setShaderInputs(this,dVar7,&progCtx);
    draw(this);
    cleanup(this,(EVP_PKEY_CTX *)&latestBuildInfo);
    Logs::~Logs(pLVar1);
    ProgramContext::~ProgramContext(&progCtx);
    measurements.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    latestProgramContext.vertShaderSource._M_dataplus._M_p =
         (pointer)&latestProgramContext.vertShaderSource.field_2;
    latestProgramContext.vertShaderSource._M_string_length = 0;
    latestProgramContext.vertShaderSource.field_2._M_local_buf[0] = '\0';
    latestProgramContext.fragShaderSource._M_dataplus._M_p =
         (pointer)&latestProgramContext.fragShaderSource.field_2;
    latestProgramContext.fragShaderSource._M_string_length = 0;
    measurements.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    measurements.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    latestProgramContext.fragShaderSource.field_2._M_local_buf[0] = '\0';
    latestBuildInfo.logs.vert._M_dataplus._M_p = (pointer)&latestBuildInfo.logs.vert.field_2;
    latestBuildInfo.logs.vert._M_string_length = 0;
    latestProgramContext.vertexAttributes.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    latestProgramContext.vertexAttributes.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    latestProgramContext.vertexAttributes.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    latestProgramContext.uniforms.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    latestBuildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
    __n = &latestBuildInfo.logs.frag.field_2;
    latestBuildInfo.logs.frag._M_string_length = 0;
    latestProgramContext.uniforms.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    latestProgramContext.uniforms.
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    latestBuildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
    latestBuildInfo.logs.link._M_dataplus._M_p = (pointer)&latestBuildInfo.logs.link.field_2;
    latestBuildInfo.logs.link._M_string_length = 0;
    latestBuildInfo.logs.link.field_2._M_local_buf[0] = '\0';
    local_710 = this;
    latestBuildInfo.logs.frag._M_dataplus._M_p = (pointer)__n;
    while( true ) {
      pSVar3 = local_710;
      bVar6 = goodEnoughMeasurements(local_710,&measurements);
      if (bVar6) break;
      (*(pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (&progCtx,pSVar3,
                 (ulong)((long)measurements.
                               super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)measurements.
                              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
      SVar18 = createShadersAndProgram(pSVar3);
      dVar7 = SVar18.program;
      buildInfo.logs.vert._M_dataplus._M_p = (pointer)&buildInfo.logs.vert.field_2;
      buildInfo.logs.vert._M_string_length = 0;
      buildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
      buildInfo.logs.frag._M_dataplus._M_p = (pointer)&buildInfo.logs.frag.field_2;
      buildInfo.logs.frag._M_string_length = 0;
      buildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
      buildInfo.logs.link._M_dataplus._M_p = (pointer)&buildInfo.logs.link.field_2;
      buildInfo.logs.link._M_string_length = 0;
      buildInfo.logs.link.field_2._M_local_buf[0] = '\0';
      statNamePrefix_1._0_12_ = SVar18;
      if (pSVar3->m_addWhitespaceAndComments == true) {
        uVar13 = pSVar3->m_startHash;
        dVar8 = ::deInt32Hash((deInt32)((ulong)((long)measurements.
                                                                                                            
                                                  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)measurements.
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 6));
        uVar13 = dVar8 ^ uVar13;
        strWithWhiteSpaceAndComments(&statNamePrefix,&progCtx.vertShaderSource,uVar13);
        std::__cxx11::string::operator=((string *)&progCtx,(string *)&statNamePrefix);
        std::__cxx11::string::~string((string *)&statNamePrefix);
        strWithWhiteSpaceAndComments(&statNamePrefix,&progCtx.fragShaderSource,uVar13);
        std::__cxx11::string::operator=
                  ((string *)&progCtx.fragShaderSource,(string *)&statNamePrefix);
        std::__cxx11::string::~string((string *)&statNamePrefix);
      }
      tcu::warmupCPU();
      local_7a8 = (code *)deGetMicroseconds();
      setShaderSources(pSVar3,SVar18.vertShader,SVar18.fragShader,&progCtx);
      local_708 = deGetMicroseconds();
      bVar6 = compileShader(pSVar3,SVar18.vertShader);
      buildInfo.vertCompileSuccess = bVar6;
      dVar9 = deGetMicroseconds();
      bVar6 = compileShader(pSVar3,SVar18.fragShader);
      buildInfo.fragCompileSuccess = bVar6;
      dVar10 = deGetMicroseconds();
      bVar6 = linkAndUseProgram(local_710,dVar7);
      buildInfo.linkSuccess = bVar6;
      dVar11 = deGetMicroseconds();
      pSVar3 = local_710;
      if (((buildInfo.vertCompileSuccess != true) || (buildInfo.fragCompileSuccess != true)) ||
         (buildInfo.linkSuccess == false)) {
        getLogs((Logs *)&statNamePrefix,local_710,(ShadersAndProgram *)&statNamePrefix_1);
        Logs::operator=(&buildInfo.logs,(Logs *)&statNamePrefix);
        Logs::~Logs((Logs *)&statNamePrefix);
        logProgramData(pSVar3,&buildInfo,&progCtx);
        cleanup(pSVar3,(EVP_PKEY_CTX *)&statNamePrefix_1);
        tcu::TestContext::setTestResult
                  ((pSVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Compilation failed");
        Logs::~Logs(&buildInfo.logs);
        ProgramContext::~ProgramContext(&progCtx);
        goto LAB_0114bdf6;
      }
      setShaderInputs(local_710,dVar7,&progCtx);
      deGetMicroseconds();
      draw(local_710);
      deGetMicroseconds();
      setShaderInputs(local_710,dVar7,&progCtx);
      deGetMicroseconds();
      draw(local_710);
      deGetMicroseconds();
      pSVar3 = local_710;
      getLogs((Logs *)&statNamePrefix,local_710,(ShadersAndProgram *)&statNamePrefix_1);
      Logs::operator=(&buildInfo.logs,(Logs *)&statNamePrefix);
      Logs::~Logs((Logs *)&statNamePrefix);
      cleanup(pSVar3,(EVP_PKEY_CTX *)&statNamePrefix_1);
      statNamePrefix.field_2._8_8_ = dVar11 - dVar10;
      statNamePrefix.field_2._M_allocated_capacity = dVar10 - dVar9;
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(dVar9 - local_708);
      statNamePrefix._M_dataplus._M_p = (pointer)(local_708 - (long)local_7a8);
      statNamePrefix._M_string_length = (size_type)__n;
      std::
      vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
      ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::Measurement>
                (&measurements,(Measurement *)&statNamePrefix);
      BuildInfo::operator=(&latestBuildInfo,&buildInfo);
      ProgramContext::operator=(&latestProgramContext,&progCtx);
      tcu::TestContext::touchWatchdog
                ((local_710->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      Logs::~Logs(&buildInfo.logs);
      ProgramContext::~ProgramContext(&progCtx);
    }
    this_00 = ((pSVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pSVar3->m_avoidCache == false) {
      psVar2 = &progCtx.vertShaderSource._M_string_length;
      progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
      std::operator<<((ostream *)psVar2,
                      "Note: Testing cache hits, so the medians and averages exclude the first iteration."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar2);
    }
    pLVar1 = &buildInfo.logs;
    buildInfo._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pLVar1);
    std::operator<<((ostream *)pLVar1,
                    "Note: \"Specialization time\" means first draw time minus second draw time.");
    progCtx.vertShaderSource._M_dataplus._M_p =
         (pointer)tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&buildInfo,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
    psVar2 = &progCtx.vertShaderSource._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
    std::operator<<((ostream *)psVar2,
                    "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pLVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buildInfo,"IterationMeasurements",(allocator<char> *)&statNamePrefix_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statNamePrefix,"Iteration measurements of compilation and linking times",
               (allocator<char> *)&local_698);
    tcu::LogSection::LogSection((LogSection *)&progCtx,(string *)&buildInfo,&statNamePrefix);
    __fd = (int)this_00;
    tcu::LogSection::write((LogSection *)&progCtx,__fd,__buf,(size_t)__n);
    tcu::LogSection::~LogSection((LogSection *)&progCtx);
    std::__cxx11::string::~string((string *)&statNamePrefix);
    std::__cxx11::string::~string((string *)&buildInfo);
    local_7ec = 0;
    while( true ) {
      if ((int)((ulong)((long)measurements.
                              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)measurements.
                             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) <= local_7ec) break;
      this_03 = measurements.
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                ._M_impl.super__Vector_impl_data._M_start + local_7ec;
      timeWithoutDraw = Measurement::totalTimeWithoutDraw(this_03);
      specializationTime = this_03->firstDrawTime - this_03->secondDrawTime;
      if (specializationTime < 1) {
        specializationTime = 0;
      }
      if ((0 < local_7ec) || (local_710->m_avoidCache == true)) {
        std::vector<long,_std::allocator<long>_>::push_back(&sourceSetTimes,&this_03->sourceSetTime)
        ;
        std::vector<long,_std::allocator<long>_>::push_back
                  (&vertexCompileTimes,&this_03->vertexCompileTime);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&fragmentCompileTimes,&this_03->fragmentCompileTime);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&programLinkTimes,&this_03->programLinkTime);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&firstInputSetTimes,&this_03->firstInputSetTime);
        std::vector<long,_std::allocator<long>_>::push_back(&firstDrawTimes,&this_03->firstDrawTime)
        ;
        progCtx.vertShaderSource._M_dataplus._M_p = (pointer)Measurement::firstPhase(this_03);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (&firstPhaseTimes,(long *)&progCtx);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&secondDrawTimes,&this_03->secondDrawTime);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&secondInputTimes,&this_03->secondInputSetTime);
        progCtx.vertShaderSource._M_dataplus._M_p =
             (pointer)(this_03->secondDrawTime + this_03->secondInputSetTime);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (&secondPhaseTimes,(long *)&progCtx);
        std::vector<long,_std::allocator<long>_>::push_back(&totalTimesWithoutDraw,&timeWithoutDraw)
        ;
        std::vector<long,_std::allocator<long>_>::push_back
                  (&specializationTimes,&specializationTime);
      }
      de::toString<int>(&local_698,&local_7ec);
      std::operator+(&statNamePrefix_1,"Measurement",&local_698);
      std::operator+(&statNamePrefix,&statNamePrefix_1,"CompilationTime");
      de::toString<int>(&local_7a0,&local_7ec);
      std::operator+(&local_7c8,"Measurement ",&local_7a0);
      std::operator+(&local_780,&local_7c8," compilation time");
      psVar12 = &local_7e8;
      std::__cxx11::string::string<std::allocator<char>>((string *)psVar12,"ms",&local_699);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix,&local_780,psVar12,QP_KEY_TAG_TIME,
                 (float)timeWithoutDraw / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_00,(size_t)psVar12);
      de::toString<int>(&local_6c0,&local_7ec);
      std::operator+(&local_730,"Measurement",&local_6c0);
      std::operator+(&local_760,&local_730,"SpecializationTime");
      de::toString<int>((string *)&rangeSpecializationTimes,&local_7ec);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeTotalTimes,"Measurement ",(string *)&rangeSpecializationTimes);
      std::operator+(&local_700,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeTotalTimes," specialization time");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"ms",&local_69a);
      psVar12 = &local_5a8;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_760,&local_700,&local_5a8,QP_KEY_TAG_TIME,
                 (float)specializationTime / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_01,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&rangeTotalTimes);
      std::__cxx11::string::~string((string *)&rangeSpecializationTimes);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&statNamePrefix);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      local_7ec = local_7ec + 1;
    }
    iVar14 = 2;
    while( true ) {
      local_7a8 = (code *)CONCAT44(local_7a8._4_4_,iVar14);
      if (iVar14 == 0) break;
      local_708 = CONCAT44(local_708._4_4_,iVar14 + -1);
      pcVar16 = "LowestHalf";
      if (iVar14 == 2) {
        pcVar16 = glcts::fixed_sample_locations_values + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statNamePrefix,pcVar16,(allocator<char> *)&progCtx);
      if (iVar14 == 2) {
        std::vector<long,_std::allocator<long>_>::vector(&rangeTotalTimes,&totalTimesWithoutDraw);
        std::vector<long,_std::allocator<long>_>::vector
                  (&rangeSpecializationTimes,&specializationTimes);
      }
      else {
        vectorLowestPercentage<long>(&rangeTotalTimes,&totalTimesWithoutDraw,0.5);
        vectorLowestPercentage<long>(&rangeSpecializationTimes,&specializationTimes,0.5);
      }
      psVar2 = &progCtx.vertShaderSource._M_string_length;
      progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
      std::operator<<((ostream *)psVar2,"\nStatistics computed from ");
      pcVar16 = "only the lowest 50%";
      if ((int)local_7a8 == 2) {
        pcVar16 = "all";
      }
      std::operator<<((ostream *)psVar2,pcVar16);
      std::operator<<((ostream *)&progCtx.vertShaderSource._M_string_length,
                      " of the above measurements:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&progCtx.vertShaderSource._M_string_length);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"Median");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Median",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatMedian<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_02,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"Median");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Median",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatMedian<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_03,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"Average");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Average",&local_7c8);
      psVar12 = &local_7a0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatAverage<long>(&rangeTotalTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_04,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"Average");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Average",&local_6c0);
      psVar12 = &local_700;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatAverage<long>(&rangeSpecializationTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_05,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"Minimum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Minimum",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatMinimum<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_06,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"Minimum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Minimum",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatMinimum<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_07,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"Maximum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Maximum",&local_7c8);
      psVar12 = &local_7a0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatMaximum<long>(&rangeTotalTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_08,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"Maximum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Maximum",&local_6c0);
      psVar12 = &local_700;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatMaximum<long>(&rangeSpecializationTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_09,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"MedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Median absolute deviation",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatMedianAbsoluteDeviation<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_10,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"MedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Median absolute deviation",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatMedianAbsoluteDeviation<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_11,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"RelativeMedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Relative median absolute deviation",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_NONE,
                 fVar17);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_12,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"RelativeMedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Relative median absolute deviation",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_7ec);
      fVar17 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_NONE,fVar17
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_13,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"StandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Standard deviation",&local_7c8);
      psVar12 = &local_7a0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatStandardDeviation<long>(&rangeTotalTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_14,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"StandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Standard deviation",&local_6c0);
      psVar12 = &local_700;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatStandardDeviation<long>(&rangeSpecializationTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_15,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"RelativeStandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Relative standard deviation",&local_7c8);
      psVar12 = &local_7a0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatRelativeStandardDeviation<long>(&rangeTotalTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_NONE,
                 fVar17);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_16,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"RelativeStandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Relative standard deviation",&local_6c0);
      psVar12 = &local_700;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar12,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_7ec);
      fVar17 = vectorFloatRelativeStandardDeviation<long>(&rangeSpecializationTimes);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_NONE,fVar17
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_17,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"MaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Max-min",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"ms",(allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatMaximumMinusMinimum<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_18,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"MaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Max-min",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"ms",(allocator<char> *)&local_7ec);
      fVar17 = vectorFloatMaximumMinusMinimum<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_TIME,
                 fVar17 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_19,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_698,&statNamePrefix,"CompilationTime");
      std::operator+(&statNamePrefix_1,&local_698,"RelativeMaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8," of compilation time",(allocator<char> *)&local_5a8);
      std::operator+(&local_780,"Relative max-min",&local_7c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&timeWithoutDraw);
      fVar17 = vectorFloatRelativeMaximumMinusMinimum<long>(&rangeTotalTimes);
      psVar12 = &local_7a0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&progCtx,&statNamePrefix_1,&local_780,psVar12,QP_KEY_TAG_NONE,
                 fVar17);
      tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_20,(size_t)psVar12);
      std::operator+(&local_760,&statNamePrefix,"SpecializationTime");
      std::operator+(&local_7e8,&local_760,"RelativeMaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0," of specialization time",
                 (allocator<char> *)&specializationTime);
      std::operator+(&local_730,"Relative max-min",&local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_7ec);
      fVar17 = vectorFloatRelativeMaximumMinusMinimum<long>(&rangeSpecializationTimes);
      psVar12 = &local_700;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&local_7e8,&local_730,psVar12,QP_KEY_TAG_NONE,fVar17
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_21,(size_t)psVar12);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      std::__cxx11::string::~string((string *)&local_698);
      if ((int)local_7a8 != 2) {
        fVar17 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&rangeTotalTimes);
        if (0.05 < fVar17) {
          psVar2 = &progCtx.vertShaderSource._M_string_length;
          progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
          std::operator<<((ostream *)psVar2,
                          "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                         );
          this_02 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&progCtx,
                               (float *)&RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD);
          std::operator<<(&(this_02->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " for compilation time of the lowest 50% of measurements");
          tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&progCtx.vertShaderSource._M_string_length);
        }
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&rangeTotalTimes.super__Vector_base<long,_std::allocator<long>_>);
      std::__cxx11::string::~string((string *)&statNamePrefix);
      iVar14 = (int)(float)local_708;
    }
    tcu::TestLog::endSection(this_00);
    for (iVar14 = 0; iVar14 != 2; iVar14 = iVar14 + 1) {
      pcVar16 = "Average";
      if (iVar14 == 0) {
        pcVar16 = "Median";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buildInfo,pcVar16,(allocator<char> *)&progCtx);
      std::operator+(&statNamePrefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buildInfo
                     ,"s");
      __n_00 = vectorFloatAverage<long>;
      if (iVar14 == 0) {
        __n_00 = vectorFloatMedian<long>;
      }
      local_7a8 = __n_00;
      std::operator+(&statNamePrefix_1,&statNamePrefix,"PerPhase");
      std::operator+(&local_698,&statNamePrefix," per phase");
      tcu::LogSection::LogSection((LogSection *)&progCtx,&statNamePrefix_1,&local_698);
      tcu::LogSection::write((LogSection *)&progCtx,__fd,__buf_22,(size_t)__n_00);
      tcu::LogSection::~LogSection((LogSection *)&progCtx);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::~string((string *)&statNamePrefix_1);
      iVar15 = 2;
      while (iVar15 != 0) {
        pcVar16 = "LowestHalf";
        if (iVar15 == 2) {
          pcVar16 = glcts::fixed_sample_locations_values + 1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&statNamePrefix_1,pcVar16,(allocator<char> *)&progCtx);
        psVar2 = &progCtx.vertShaderSource._M_string_length;
        progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
        pcVar16 = "\nFor only the lowest 50% of the measurements:";
        if (iVar15 == 2) {
          pcVar16 = "For all measurements:";
        }
        std::operator<<((ostream *)psVar2,pcVar16);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&progCtx.vertShaderSource._M_string_length);
        std::operator+(&local_780,&statNamePrefix_1,"ShaderSourceSetTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"shader source set time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        local_708 = CONCAT44(local_708._4_4_,*(float *)(&DAT_01830204 + (ulong)(iVar15 == 2) * 4));
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&sourceSetTimes,
                   *(float *)(&DAT_01830204 + (ulong)(iVar15 == 2) * 4));
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_23,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"VertexShaderCompileTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"vertex shader compile time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&vertexCompileTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_24,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"FragmentShaderCompileTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"fragment shader compile time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&fragmentCompileTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_25,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"ProgramLinkTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"program link time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&programLinkTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_26,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"FirstShaderInputSetTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"first shader input set time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&firstInputSetTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_27,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"FirstDrawTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"first draw time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&firstDrawTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_28,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"SecondShaderInputSetTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"second shader input set time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&secondInputTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_29,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&statNamePrefix_1,"SecondDrawTime");
        std::operator+(&local_698,&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo);
        std::operator+(&local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildInfo," of ");
        std::operator+(&local_7c8,&local_7a0,"second draw time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"ms",(allocator<char> *)&local_730);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_760,&secondDrawTimes,
                   (float)local_708);
        fVar17 = (float)(*local_7a8)(&local_760);
        psVar12 = &local_7e8;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&progCtx,&local_698,&local_7c8,psVar12,QP_KEY_TAG_TIME,
                   fVar17 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&progCtx,__fd,__buf_30,(size_t)psVar12);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&progCtx);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_760);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_780);
        std::__cxx11::string::~string((string *)&statNamePrefix_1);
        iVar15 = iVar15 + -1;
      }
      tcu::TestLog::endSection(this_00);
      std::__cxx11::string::~string((string *)&statNamePrefix);
      std::__cxx11::string::~string((string *)&buildInfo);
    }
    psVar2 = &progCtx.vertShaderSource._M_string_length;
    progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
    std::operator<<((ostream *)psVar2,
                    "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times"
                   );
    pSVar3 = local_710;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar2);
    fVar17 = vectorFloatFirstQuartile<long>(&totalTimesWithoutDraw);
    this_01 = (pSVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_(&progCtx.vertShaderSource,(de *)0x2,fVar17 / 1000.0,precision);
    tcu::TestContext::setTestResult
              (this_01,QP_TEST_RESULT_PASS,progCtx.vertShaderSource._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&progCtx);
    if ((pSVar3->m_avoidCache != false) || (pSVar3->m_addWhitespaceAndComments == true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buildInfo,
                 "Note: the following shaders are the ones from the last iteration; ",
                 (allocator<char> *)&progCtx);
      if (pSVar3->m_avoidCache == true) {
        std::__cxx11::string::append(&buildInfo.vertCompileSuccess);
      }
      if (pSVar3->m_addWhitespaceAndComments == true) {
        pcVar16 = glcts::fixed_sample_locations_values + 1;
        if (pSVar3->m_avoidCache != false) {
          pcVar16 = " as well as ";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&statNamePrefix,pcVar16,(allocator<char> *)&statNamePrefix_1);
        std::operator+(&progCtx.vertShaderSource,&statNamePrefix,"whitespace and comments");
        std::__cxx11::string::append((string *)&buildInfo);
        std::__cxx11::string::~string((string *)&progCtx);
        std::__cxx11::string::~string((string *)&statNamePrefix);
      }
      std::__cxx11::string::append(&buildInfo.vertCompileSuccess);
      psVar2 = &progCtx.vertShaderSource._M_string_length;
      progCtx.vertShaderSource._M_dataplus._M_p = (pointer)this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
      std::operator<<((ostream *)psVar2,(char *)buildInfo._0_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&progCtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar2);
      std::__cxx11::string::~string((string *)&buildInfo);
    }
    logProgramData(pSVar3,&latestBuildInfo,&latestProgramContext);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&specializationTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&secondInputTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&programLinkTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>);
LAB_0114bdf6:
    Logs::~Logs(&latestBuildInfo.logs);
    ProgramContext::~ProgramContext(&latestProgramContext);
    std::
    _Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
    ::~_Vector_base(&measurements.
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                   );
  }
  else {
    getLogs((Logs *)&latestProgramContext,this,(ShadersAndProgram *)&latestBuildInfo);
    Logs::operator=(pLVar1,(Logs *)&latestProgramContext);
    Logs::~Logs((Logs *)&latestProgramContext);
    logProgramData(this,&buildInfo,&progCtx);
    cleanup(this,(EVP_PKEY_CTX *)&latestBuildInfo);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compilation failed");
    Logs::~Logs(pLVar1);
    ProgramContext::~ProgramContext(&progCtx);
  }
  return STOP;
}

Assistant:

ShaderCompilerCase::IterateResult ShaderCompilerCase::iterate (void)
{
	// Before actual measurements, compile and draw with a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.vertexAttributes = singleValueShaderAttributes(getNameSpecialization(specID));

		ShadersAndProgram shadersAndProgram = createShadersAndProgram();
		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess	= compileShader(shadersAndProgram.vertShader);
		buildInfo.fragCompileSuccess	= compileShader(shadersAndProgram.fragShader);
		buildInfo.linkSuccess			= linkAndUseProgram(shadersAndProgram.program);
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}
		setShaderInputs(shadersAndProgram.program, progCtx);
		draw();
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shaders, compile & link, set shader inputs and draw. Time measurement is done at relevant points.
		// \note Setting inputs and drawing are done twice in order to find out the time for actual compiling.

		// \note Shader data (sources and inputs) are generated and GL shader and program objects are created before any time measurements.
		ProgramContext		progCtx				= generateShaderData((int)measurements.size());
		ShadersAndProgram	shadersAndProgram	= createShadersAndProgram();
		BuildInfo			buildInfo;

		if (m_addWhitespaceAndComments)
		{
			const deUint32 hash = m_startHash ^ (deUint32)deInt32Hash((deInt32)measurements.size());
			progCtx.vertShaderSource = strWithWhiteSpaceAndComments(progCtx.vertShaderSource, hash);
			progCtx.fragShaderSource = strWithWhiteSpaceAndComments(progCtx.fragShaderSource, hash);
		}

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shadersAndProgram.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shadersAndProgram.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.linkSuccess = linkAndUseProgram(shadersAndProgram.program);
		deUint64 programLinkEndTime = deGetMicroseconds();

		// Check compilation and linking status here, after all compilation and linking gl calls are made.
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 firstShaderInputSetEndTime = deGetMicroseconds();

		// Draw for the first time.
		draw();
		deUint64 firstDrawEndTime = deGetMicroseconds();

		// Set inputs and draw again.

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 secondShaderInputSetEndTime = deGetMicroseconds();

		draw();
		deUint64 secondDrawEndTime = deGetMicroseconds();

		// De-initializations (detach shaders etc.).

		buildInfo.logs = getLogs(shadersAndProgram);
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime),
										   (deInt64)(programLinkEndTime				- fragmentShaderCompileEndTime),
										   (deInt64)(firstShaderInputSetEndTime		- programLinkEndTime),
										   (deInt64)(firstDrawEndTime				- firstShaderInputSetEndTime),
										   (deInt64)(secondShaderInputSetEndTime	- firstDrawEndTime),
										   (deInt64)(secondDrawEndTime				- secondShaderInputSetEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> programLinkTimes;
		vector<deInt64> firstInputSetTimes;
		vector<deInt64> firstDrawTimes;
		vector<deInt64> secondInputTimes;
		vector<deInt64> secondDrawTimes;
		vector<deInt64> firstPhaseTimes;
		vector<deInt64> secondPhaseTimes;
		vector<deInt64> totalTimesWithoutDraw;
		vector<deInt64> specializationTimes;

		if (!m_avoidCache)
			log << TestLog::Message << "Note: Testing cache hits, so the medians and averages exclude the first iteration." << TestLog::EndMessage;

		log << TestLog::Message << "Note: \"Specialization time\" means first draw time minus second draw time." << TestLog::EndMessage
			<< TestLog::Message << "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time." << TestLog::EndMessage;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation and linking times");

		DE_ASSERT((int)measurements.size() > (m_avoidCache ? 0 : 1));

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			const Measurement& curMeas = measurements[ndx];

			// Subtract time of second phase (second input setup and draw) from first (from start to end of first draw).
			// \note Cap if second phase seems unreasonably high (higher than first input set and draw).
			deInt64 timeWithoutDraw		= curMeas.totalTimeWithoutDraw();

			// Specialization time = first draw - second draw time. Again, cap at 0 if second draw was longer than first draw.
			deInt64 specializationTime	= de::max<deInt64>(0, curMeas.firstDrawTime - curMeas.secondDrawTime);

			if (ndx > 0 || m_avoidCache) // \note When allowing cache hits, don't account for the first measurement when calculating median or average.
			{
				sourceSetTimes.push_back		(curMeas.sourceSetTime);
				vertexCompileTimes.push_back	(curMeas.vertexCompileTime);
				fragmentCompileTimes.push_back	(curMeas.fragmentCompileTime);
				programLinkTimes.push_back		(curMeas.programLinkTime);
				firstInputSetTimes.push_back	(curMeas.firstInputSetTime);
				firstDrawTimes.push_back		(curMeas.firstDrawTime);
				firstPhaseTimes.push_back		(curMeas.firstPhase());
				secondDrawTimes.push_back		(curMeas.secondDrawTime);
				secondInputTimes.push_back		(curMeas.secondInputSetTime);
				secondPhaseTimes.push_back		(curMeas.secondPhase());
				totalTimesWithoutDraw.push_back	(timeWithoutDraw);
				specializationTimes.push_back	(specializationTime);
			}

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "CompilationTime",
								  "Measurement " + de::toString(ndx) + " compilation time",
								  "ms", QP_KEY_TAG_TIME, (float)timeWithoutDraw / 1000.0f)
				<< TestLog::Float("Measurement" + de::toString(ndx) + "SpecializationTime",
								  "Measurement " + de::toString(ndx) + " specialization time",
								  "ms", QP_KEY_TAG_TIME, (float)specializationTime / 1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange				= entireRangeOrLowestHalf == 0;
			string				statNamePrefix				= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTotalTimes				= isEntireRange ? totalTimesWithoutDraw	: vectorLowestPercentage(totalTimesWithoutDraw,	0.5f);
			vector<deInt64>		rangeSpecializationTimes	= isEntireRange ? specializationTimes	: vectorLowestPercentage(specializationTimes,	0.5f);

#define LOG_COMPILE_SPECIALIZE_TIME_STAT(NAME, DESC, FUNC)																													\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeTotalTimes)/1000.0f)		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeSpecializationTimes)/1000.0f)

#define LOG_COMPILE_SPECIALIZE_RELATIVE_STAT(NAME, DESC, FUNC)																										\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeTotalTimes))		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeSpecializationTimes))

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_COMPILE_SPECIALIZE_RELATIVE_STAT
#undef LOG_COMPILE_SPECIALIZE_TIME_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTotalTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value "
										<< RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD
										<< " for compilation time of the lowest 50% of measurements" << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);
				LOG_TIME("ProgramLinkTime",				"program link time",				programLinkTimes);
				LOG_TIME("FirstShaderInputSetTime",		"first shader input set time",		firstInputSetTimes);
				LOG_TIME("FirstDrawTime",				"first draw time",					firstDrawTimes);
				LOG_TIME("SecondShaderInputSetTime",	"second shader input set time",		secondInputTimes);
				LOG_TIME("SecondDrawTime",				"second draw time",					secondDrawTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimesWithoutDraw) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		if (m_avoidCache || m_addWhitespaceAndComments)
		{
			string msg = "Note: the following shaders are the ones from the last iteration; ";

			if (m_avoidCache)
				msg += "variables' names and some constant expressions";
			if (m_addWhitespaceAndComments)
				msg += string(m_avoidCache ? " as well as " : "") + "whitespace and comments";

			msg += " differ between iterations.";

			log << TestLog::Message << msg.c_str() << TestLog::EndMessage;
		}

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}